

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O0

bool __thiscall Js::ByteCodeWriter::DoProfileNewScObjArrayOp(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  bool local_21;
  bool local_13;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,NativeArrayPhase,sourceContextId,functionId);
  local_13 = false;
  if (!bVar1) {
    bVar1 = FunctionProxy::IsInDebugMode((FunctionProxy *)this->m_functionWrite);
    local_13 = false;
    if (!bVar1) {
      local_21 = op == NewScObjArray || op == NewScObjArraySpread;
      local_13 = local_21;
    }
  }
  return local_13;
}

Assistant:

bool DoProfileNewScObjArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScObjArray || op == OpCode::NewScObjArraySpread);
        }